

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_stdlib.c
# Opt level: O0

void p2sc_spawn_many(char **cmd,int num)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  gchar **argv;
  gint argc;
  GPid *pid;
  GError *err;
  int status;
  int i;
  undefined8 local_38;
  undefined1 local_2c [4];
  long local_28;
  long local_20;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_20 = 0;
  local_c = in_ESI;
  local_8 = in_RDI;
  local_28 = g_malloc((long)in_ESI << 2);
  local_10 = 0;
  while( true ) {
    if (local_c <= local_10) {
      for (local_10 = 0; local_10 < local_c; local_10 = local_10 + 1) {
        waitpid(*(__pid_t *)(local_28 + (long)local_10 * 4),&local_14,0);
        g_spawn_close_pid(*(undefined4 *)(local_28 + (long)local_10 * 4));
      }
      g_free(local_28);
      return;
    }
    iVar1 = g_shell_parse_argv(*(undefined8 *)(local_8 + (long)local_10 * 8),local_2c,&local_38,
                               &local_20);
    if (iVar1 == 0) break;
    iVar1 = g_spawn_async(0,local_38,0,0x1e,0,0,local_28 + (long)local_10 * 4,&local_20);
    if (iVar1 == 0) {
      if ((local_20 != 0) && (*(long *)(local_20 + 8) != 0)) {
        _p2sc_msg("p2sc_spawn_many",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_stdlib.c"
                  ,0xca,"$Id: p2sc_stdlib.c 5108 2014-06-19 12:29:23Z bogdan $",4000,
                  "spawn_async(%s): %s",*(undefined8 *)(local_8 + (long)local_10 * 8),
                  *(undefined8 *)(local_20 + 8));
        exit(1);
      }
      _p2sc_msg("p2sc_spawn_many",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_stdlib.c"
                ,0xcd,"$Id: p2sc_stdlib.c 5108 2014-06-19 12:29:23Z bogdan $",4000,
                "spawn_aync(%s): unknown failure",*(undefined8 *)(local_8 + (long)local_10 * 8));
      exit(1);
    }
    g_strfreev(local_38);
    local_10 = local_10 + 1;
  }
  if ((local_20 != 0) && (*(long *)(local_20 + 8) != 0)) {
    _p2sc_msg("p2sc_spawn_many",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_stdlib.c"
              ,0xbe,"$Id: p2sc_stdlib.c 5108 2014-06-19 12:29:23Z bogdan $",4000,
              "shell_parse_argv(%s): %s",*(undefined8 *)(local_8 + (long)local_10 * 8),
              *(undefined8 *)(local_20 + 8));
    exit(1);
  }
  _p2sc_msg("p2sc_spawn_many",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_stdlib.c"
            ,0xc1,"$Id: p2sc_stdlib.c 5108 2014-06-19 12:29:23Z bogdan $",4000,
            "shell_parse_argv(%s): unknown failure",*(undefined8 *)(local_8 + (long)local_10 * 8));
  exit(1);
}

Assistant:

void p2sc_spawn_many(const char **cmd, int num) {
    int i, status;
    GError *err = NULL;
    GPid *pid = (GPid *) g_malloc(num * sizeof *pid);

    for (i = 0; i < num; ++i) {
        gint argc;
        gchar **argv;

        if (!g_shell_parse_argv(cmd[i], &argc, &argv, &err)) {
            if (err && err->message) {
                P2SC_Msg(LVL_FATAL, "shell_parse_argv(%s): %s", cmd[i], err->message);
                g_error_free(err);
            } else
                P2SC_Msg(LVL_FATAL, "shell_parse_argv(%s): unknown failure", cmd[i]);
        }

        if (!g_spawn_async(NULL, argv, NULL,
                           (GSpawnFlags) (G_SPAWN_SEARCH_PATH |
                                          G_SPAWN_STDOUT_TO_DEV_NULL |
                                          G_SPAWN_STDERR_TO_DEV_NULL |
                                          G_SPAWN_DO_NOT_REAP_CHILD), NULL, NULL, pid + i, &err)) {
            if (err && err->message) {
                P2SC_Msg(LVL_FATAL, "spawn_async(%s): %s", cmd[i], err->message);
                g_error_free(err);
            } else
                P2SC_Msg(LVL_FATAL, "spawn_aync(%s): unknown failure", cmd[i]);
        }

        g_strfreev(argv);
    }
    /* wait for our children */
    for (i = 0; i < num; ++i) {
        waitpid(pid[i], &status, 0);
        g_spawn_close_pid(pid[i]);
    }

    g_free(pid);
}